

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_full.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::ReflectionFallback
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  DescriptorPool *this;
  uint *puVar1;
  Message *this_00;
  Descriptor *this_01;
  FieldDescriptor *field;
  char *pcVar2;
  ExtensionRange *pEVar3;
  uint uVar4;
  Metadata MVar5;
  
  if (ptr == (char *)0x0) {
    ptr = (char *)&GenericFallbackImpl<google::protobuf::Message,_google::protobuf::UnknownFieldSet>
                   ::kOps;
  }
  else {
    if ((ulong)table->has_bits_offset != 0) {
      puVar1 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar1 & 3) != 0) {
        AlignFail(puVar1);
      }
      *puVar1 = *puVar1 | (uint)hasbits;
    }
    uVar4 = data.field_0._0_4_;
    if (uVar4 != 0 && (uVar4 & 7) != 4) {
      this_00 = DownCastMessage<google::protobuf::Message>(msg);
      MVar5 = Message::GetMetadata(this_00);
      this_01 = MVar5.descriptor;
      MVar5 = Message::GetMetadata(this_00);
      uVar4 = (uint)((ulong)data.field_0 >> 3) & 0x1fffffff;
      field = Descriptor::FindFieldByNumber(this_01,uVar4);
      if (field == (FieldDescriptor *)0x0) {
        pEVar3 = Descriptor::FindExtensionRangeContainingNumber(this_01,uVar4);
        if (pEVar3 == (ExtensionRange *)0x0) {
          field = (FieldDescriptor *)0x0;
        }
        else {
          this = (ctx->data_).pool;
          if (this == (DescriptorPool *)0x0) {
            field = Reflection::FindKnownExtensionByNumber(MVar5.reflection,uVar4);
          }
          else {
            field = DescriptorPool::FindExtensionByNumber(this,this_01,uVar4);
          }
        }
      }
      pcVar2 = WireFormat::_InternalParseAndMergeField
                         (this_00,ptr,ctx,(ulong)data.field_0 & 0xffffffff,MVar5.reflection,field);
      return pcVar2;
    }
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar4 - 1;
  }
  return (char *)(UnknownFieldOps *)ptr;
}

Assistant:

const char* TcParser::ReflectionFallback(PROTOBUF_TC_PARAM_DECL) {
  bool must_fallback_to_generic = (ptr == nullptr);
  if (ABSL_PREDICT_FALSE(must_fallback_to_generic)) {
    PROTOBUF_MUSTTAIL return GenericFallback(PROTOBUF_TC_PARAM_PASS);
  }

  SyncHasbits(msg, hasbits, table);
  uint32_t tag = data.tag();
  if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
    ctx->SetLastTag(tag);
    return ptr;
  }

  auto* full_msg = DownCastMessage<Message>(msg);
  auto* descriptor = full_msg->GetDescriptor();
  auto* reflection = full_msg->GetReflection();
  int field_number = WireFormatLite::GetTagFieldNumber(tag);
  const FieldDescriptor* field = descriptor->FindFieldByNumber(field_number);

  // If that failed, check if the field is an extension.
  if (field == nullptr && descriptor->IsExtensionNumber(field_number)) {
    if (ctx->data().pool == nullptr) {
      field = reflection->FindKnownExtensionByNumber(field_number);
    } else {
      field = ctx->data().pool->FindExtensionByNumber(descriptor, field_number);
    }
  }

  return WireFormat::_InternalParseAndMergeField(full_msg, ptr, ctx, tag,
                                                 reflection, field);
}